

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrape.c
# Opt level: O1

course_results * scrape_html(char *html)

{
  int iVar1;
  course_results *__ptr;
  course *pcVar2;
  int *piVar3;
  char *__ptr_00;
  ulong uVar4;
  course_strings course_data;
  size_t i;
  course_strings local_b0;
  size_t local_38;
  
  __ptr = (course_results *)malloc(0x10);
  if (__ptr != (course_results *)0x0) {
    __ptr->length = 0;
    pcVar2 = (course *)malloc(0x208);
    __ptr->courses = pcVar2;
    if (pcVar2 != (course *)0x0) goto LAB_001055d2;
    free(__ptr);
  }
  __ptr = (course_results *)0x0;
LAB_001055d2:
  if (__ptr == (course_results *)0x0) {
LAB_00105c7b:
    __ptr = (course_results *)0x0;
  }
  else {
    local_38 = 0;
    if (*html != '\0') {
      uVar4 = 5;
      do {
        if ((uVar4 <= __ptr->length + 1) &&
           (pcVar2 = (course *)realloc(__ptr->courses,uVar4 * 0xd0), pcVar2 != (course *)0x0)) {
          uVar4 = uVar4 * 2;
          __ptr->courses = pcVar2;
        }
        local_b0.course_name = find_next(html,&local_38,"_lnkbtn_courseTitle",0x12,'>','<');
        if (local_b0.course_name == (char *)0x0) {
LAB_00105c60:
          free(__ptr->courses);
          free(__ptr);
          piVar3 = __errno_location();
          *piVar3 = -0x69;
          goto LAB_00105c7b;
        }
        local_b0.instructor = find_next(html,&local_38,"<b>Instructor:",0xd,'>','<');
        __ptr_00 = local_b0.course_name;
        if (local_b0.instructor == (char *)0x0) {
LAB_00105c5b:
          free(__ptr_00);
          goto LAB_00105c60;
        }
        local_b0.units = find_next(html,&local_38,"<b>Units:",8,'>','<');
        if (local_b0.units == (char *)0x0) {
          free(local_b0.course_name);
          __ptr_00 = local_b0.instructor;
          goto LAB_00105c5b;
        }
        local_b0.max_enroll = find_next(html,&local_38,"<b>Max Enroll</b>",0x10,':','<');
        if (local_b0.max_enroll == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          __ptr_00 = local_b0.units;
          goto LAB_00105c5b;
        }
        local_b0.pre_requisites = find_next(html,&local_38,"<b>Prerequisities:",0x11,'>','<');
        if (local_b0.pre_requisites == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          __ptr_00 = local_b0.max_enroll;
          goto LAB_00105c5b;
        }
        local_b0.final_exam = find_next(html,&local_38,"<b>Final Exam:",0xd,'>','\n');
        if (local_b0.final_exam == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          __ptr_00 = local_b0.pre_requisites;
          goto LAB_00105c5b;
        }
        local_b0.class_type = find_next(html,&local_38,"<td",3,'>','<');
        if (local_b0.class_type == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          __ptr_00 = local_b0.final_exam;
          goto LAB_00105c5b;
        }
        local_b0.days = find_next(html,&local_38,"<td",3,'>','<');
        if (local_b0.days == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          free(local_b0.final_exam);
          __ptr_00 = local_b0.class_type;
          goto LAB_00105c5b;
        }
        local_b0.times = find_next(html,&local_38,"<td",3,'<','>');
        if (local_b0.times == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          free(local_b0.final_exam);
          free(local_b0.class_type);
          __ptr_00 = local_b0.days;
          goto LAB_00105c5b;
        }
        local_b0.available_seats = find_next(html,&local_38,"_lbl_seeDetails",0xe,'>','<');
        if (local_b0.available_seats == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          free(local_b0.final_exam);
          free(local_b0.class_type);
          free(local_b0.days);
          __ptr_00 = local_b0.times;
          goto LAB_00105c5b;
        }
        local_b0.course_status = find_next(html,&local_38,"<font size=1",0xb,'>','<');
        if (local_b0.course_status == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          free(local_b0.final_exam);
          free(local_b0.class_type);
          free(local_b0.days);
          __ptr_00 = local_b0.available_seats;
          goto LAB_00105c5b;
        }
        local_b0.course_id = find_next(html,&local_38,"<td",3,'>','<');
        if (local_b0.course_id == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          free(local_b0.final_exam);
          free(local_b0.class_type);
          free(local_b0.days);
          free(local_b0.available_seats);
          __ptr_00 = local_b0.course_status;
          goto LAB_00105c5b;
        }
        local_b0.section_number = find_next(html,&local_38,"<td",3,'>','<');
        if (local_b0.section_number == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          free(local_b0.final_exam);
          free(local_b0.class_type);
          free(local_b0.days);
          free(local_b0.available_seats);
          free(local_b0.course_status);
          __ptr_00 = local_b0.course_id;
          goto LAB_00105c5b;
        }
        local_b0.call_number = find_next(html,&local_38,"<td",3,'>','<');
        if (local_b0.call_number == (char *)0x0) {
          free(local_b0.course_name);
          free(local_b0.instructor);
          free(local_b0.units);
          free(local_b0.max_enroll);
          free(local_b0.pre_requisites);
          free(local_b0.final_exam);
          free(local_b0.class_type);
          free(local_b0.days);
          free(local_b0.available_seats);
          free(local_b0.course_status);
          free(local_b0.course_id);
          __ptr_00 = local_b0.section_number;
          goto LAB_00105c5b;
        }
        iVar1 = create_course(__ptr->courses + __ptr->length,&local_b0);
        if (iVar1 != 0) goto LAB_00105c60;
      } while (html[local_38] != '\0');
    }
    __ptr->courses = (course *)0x0;
    __ptr->length = 0;
  }
  return __ptr;
}

Assistant:

struct course_results *scrape_html(const char *html)
{
	struct course_results *results;
	size_t capacity;
	size_t i;
	int ret;

	results = init_course_results(&capacity);
	if (!results) {
		return NULL;
	}

	i = 0;
	while (html[i]) {
		struct course_strings course_data;
		struct course *course;

		if (results->length + 1 >= capacity) {
			resize_course_results(results, &capacity);
		}

		ret = read_course_data(&course_data, html, &i);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}

		course = (struct course *)(&results->courses[results->length]);
		ret = create_course(course, &course_data);
		if (ret) {
			destroy_course_results(results);
			errno = UCRCOURSE_ERR_RESPONSE;
			return NULL;
		}
	}

	/* TEMP */
	results->courses = NULL;
	results->length = 0;

	return results;
}